

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http.c
# Opt level: O2

char * ngx_http_merge_locations
                 (ngx_conf_t *cf,ngx_queue_t *locations,void **loc_conf,ngx_http_module_t *module,
                 ngx_uint_t ctx_index)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ngx_queue_t *pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  ngx_queue_t *pnVar7;
  ngx_queue_t *pnVar8;
  ngx_http_conf_ctx_t saved;
  
  if (locations == (ngx_queue_t *)0x0) {
LAB_0013668c:
    pcVar6 = (char *)0x0;
  }
  else {
    puVar1 = (undefined8 *)cf->ctx;
    uVar2 = puVar1[2];
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    pnVar7 = locations;
    do {
      pnVar7 = pnVar7->next;
      if (pnVar7 == locations) {
        puVar1[2] = uVar2;
        *puVar1 = uVar4;
        puVar1[1] = uVar5;
        goto LAB_0013668c;
      }
      pnVar8 = pnVar7[1].prev;
      if (pnVar8 == (ngx_queue_t *)0x0) {
        pnVar8 = pnVar7[1].next;
      }
      pnVar3 = pnVar8[3].prev;
      puVar1[2] = pnVar3;
      pcVar6 = (*module->merge_loc_conf)(cf,loc_conf[ctx_index],(&pnVar3->prev)[ctx_index]);
    } while ((pcVar6 == (char *)0x0) &&
            (pcVar6 = ngx_http_merge_locations
                                (cf,pnVar8[0x29].next,&(pnVar8[3].prev)->prev,module,ctx_index),
            pcVar6 == (char *)0x0));
  }
  return pcVar6;
}

Assistant:

static char *
ngx_http_merge_locations(ngx_conf_t *cf, ngx_queue_t *locations,
    void **loc_conf, ngx_http_module_t *module, ngx_uint_t ctx_index)
{
    char                       *rv;
    ngx_queue_t                *q;
    ngx_http_conf_ctx_t        *ctx, saved;
    ngx_http_core_loc_conf_t   *clcf;
    ngx_http_location_queue_t  *lq;

    if (locations == NULL) {
        return NGX_CONF_OK;
    }

    ctx = (ngx_http_conf_ctx_t *) cf->ctx;
    saved = *ctx;

    for (q = ngx_queue_head(locations);
         q != ngx_queue_sentinel(locations);
         q = ngx_queue_next(q))
    {
        lq = (ngx_http_location_queue_t *) q;

        clcf = lq->exact ? lq->exact : lq->inclusive;
        ctx->loc_conf = clcf->loc_conf;

        rv = module->merge_loc_conf(cf, loc_conf[ctx_index],
                                    clcf->loc_conf[ctx_index]);
        if (rv != NGX_CONF_OK) {
            return rv;
        }

        rv = ngx_http_merge_locations(cf, clcf->locations, clcf->loc_conf,
                                      module, ctx_index);
        if (rv != NGX_CONF_OK) {
            return rv;
        }
    }

    *ctx = saved;

    return NGX_CONF_OK;
}